

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcat_s.c
# Opt level: O3

int main(void)

{
  errno_t eVar1;
  char s [10];
  undefined8 local_18;
  undefined2 local_10;
  
  local_18 = 0x7878787878007878;
  local_10 = 0x78;
  set_constraint_handler_s(test_handler);
  eVar1 = strcat_s((char *)&local_18,10,"abcde");
  if (eVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcat_s.c, line %d - %s\n"
           ,0x4a,"strcat_s( s, 10, abcde ) == 0");
  }
  if (local_18._2_1_ != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcat_s.c, line %d - %s\n"
           ,0x4b,"s[2] == \'a\'");
  }
  if (local_18._6_1_ != 'e') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcat_s.c, line %d - %s\n"
           ,0x4c,"s[6] == \'e\'");
  }
  if (local_18._7_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcat_s.c, line %d - %s\n"
           ,0x4d,"s[7] == \'\\0\'");
  }
  if ((char)local_10 != 'x') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcat_s.c, line %d - %s\n"
           ,0x4e,"s[8] == \'x\'");
  }
  local_18 = local_18 & 0xffffffffffffff00;
  eVar1 = strcat_s((char *)&local_18,10,"abcdx");
  if (eVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcat_s.c, line %d - %s\n"
           ,0x50,"strcat_s( s, 10, abcdx ) == 0");
  }
  if (local_18._4_1_ != 'x') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcat_s.c, line %d - %s\n"
           ,0x51,"s[4] == \'x\'");
  }
  if (local_18._5_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcat_s.c, line %d - %s\n"
           ,0x52,"s[5] == \'\\0\'");
  }
  eVar1 = strcat_s((char *)&local_18,10,"");
  if (eVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcat_s.c, line %d - %s\n"
           ,0x53,"strcat_s( s, 10, \"\\0\" ) == 0");
  }
  if (local_18._5_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcat_s.c, line %d - %s\n"
           ,0x54,"s[5] == \'\\0\'");
  }
  if (local_18._6_1_ != 'e') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcat_s.c, line %d - %s\n"
           ,0x55,"s[6] == \'e\'");
  }
  eVar1 = strcat_s((char *)&local_18,6,"");
  if (eVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcat_s.c, line %d - %s\n"
           ,0x57,"strcat_s( s, 6, \"\" ) == 0");
  }
  eVar1 = strcat_s((char *)&local_18,5,"");
  if (eVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcat_s.c, line %d - %s\n"
           ,0x58,"strcat_s( s, 5, \"\" ) != 0");
  }
  eVar1 = strcat_s((char *)&local_18,7,"x");
  if (eVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcat_s.c, line %d - %s\n"
           ,0x59,"strcat_s( s, 7, \"x\" ) == 0");
  }
  if (local_18._5_1_ != 'x') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcat_s.c, line %d - %s\n"
           ,0x5a,"s[5] == \'x\'");
  }
  if (local_18._6_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcat_s.c, line %d - %s\n"
           ,0x5b,"s[6] == \'\\0\'");
  }
  eVar1 = strcat_s((char *)&local_18,7,(char *)((long)&local_18 + 6));
  if (eVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcat_s.c, line %d - %s\n"
           ,0x5e,"strcat_s( s, 7, s + 6 ) != 0");
  }
  local_18._0_4_ = (uint)(uint3)local_18;
  eVar1 = strcat_s((char *)((long)&local_18 + 3),4,(char *)&local_18);
  if (eVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcat_s.c, line %d - %s\n"
           ,0x60,"strcat_s( s + 3, 4, s ) != 0");
  }
  if (HANDLER_CALLS != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcat_s.c, line %d - %s\n"
           ,0x62,"HANDLER_CALLS == 3");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#if ! defined( REGTEST ) || defined( __STDC_LIB_EXT1__ )
    char s[] = "xx\0xxxxxx";
    set_constraint_handler_s( test_handler );

    TESTCASE( strcat_s( s, 10, abcde ) == 0 );
    TESTCASE( s[2] == 'a' );
    TESTCASE( s[6] == 'e' );
    TESTCASE( s[7] == '\0' );
    TESTCASE( s[8] == 'x' );
    s[0] = '\0';
    TESTCASE( strcat_s( s, 10, abcdx ) == 0 );
    TESTCASE( s[4] == 'x' );
    TESTCASE( s[5] == '\0' );
    TESTCASE( strcat_s( s, 10, "\0" ) == 0 );
    TESTCASE( s[5] == '\0' );
    TESTCASE( s[6] == 'e' );

    TESTCASE( strcat_s( s, 6, "" ) == 0 );
    TESTCASE( strcat_s( s, 5, "" ) != 0 );
    TESTCASE( strcat_s( s, 7, "x" ) == 0 );
    TESTCASE( s[5] == 'x' );
    TESTCASE( s[6] == '\0' );

    /* Overlapping */
    TESTCASE( strcat_s( s, 7, s + 6 ) != 0 );
    s[3] = '\0';
    TESTCASE( strcat_s( s + 3, 4, s ) != 0 );

    TESTCASE( HANDLER_CALLS == 3 );
#endif
    return TEST_RESULTS;
}